

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

void __thiscall
mnf::CartesianProduct::applyInvTransport_
          (CartesianProduct *this,RefMat *out,ConstRefMat *in,ConstRefVec *x,ConstRefVec *v)

{
  ulong uVar1;
  size_type sVar2;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  ConstSegment local_208;
  ConstRefVec local_1d0;
  ConstSegment local_198;
  ConstRefVec local_160;
  DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true>_>
  local_138 [56];
  ConstRefMat local_100;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_c0;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true>_>
  local_98 [56];
  RefMat local_60;
  ulong local_38;
  size_t i;
  ConstRefVec *v_local;
  ConstRefVec *x_local;
  ConstRefMat *in_local;
  RefMat *out_local;
  CartesianProduct *this_local;
  
  local_38 = 0;
  i = (size_t)v;
  v_local = x;
  x_local = (ConstRefVec *)in;
  in_local = (ConstRefMat *)out;
  out_local = (RefMat *)this;
  while( true ) {
    uVar1 = local_38;
    sVar2 = std::
            vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            ::size(&this->subManifolds_);
    if (sVar2 <= uVar1) break;
    this_00 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
              ::operator[](&this->subManifolds_,local_38);
    this_01 = std::
              __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Ref
              (&local_c0,out);
    Manifold::getView<2,1>((Type *)local_98,&this->super_Manifold,&local_c0,local_38);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,true>>
              ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_60,
               local_98,(type *)0x0);
    Manifold::getConstView<2,1>
              ((Type *)local_138,&this->super_Manifold,(ConstRefMat *)x_local,local_38);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const,_1,_1,true>>
              ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_100,
               local_138,(type *)0x0);
    Manifold::getConstView<0>(&local_198,&this->super_Manifold,v_local,local_38);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_160,
               (DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_198,(type *)0x0);
    Manifold::getConstView<1>(&local_208,&this->super_Manifold,(ConstRefVec *)i,local_38);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_1d0,
               (DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_208,(type *)0x0);
    Manifold::applyInvTransport(this_01,&local_60,&local_100,&local_160,&local_1d0);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_1d0);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_160);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
              (&local_100);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void CartesianProduct::applyInvTransport_(RefMat out, const ConstRefMat& in,
                                          const ConstRefVec& x,
                                          const ConstRefVec& v) const
{
  for (size_t i = 0; i < subManifolds_.size(); ++i)
  {
    subManifolds_[i]->applyInvTransport(
        getView<F, T>(out, i), getConstView<F, T>(in, i), getConstView<R>(x, i),
        getConstView<T>(v, i));
  }
}